

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O2

MPP_RET dec_vproc_start(MppDecVprocCtx ctx)

{
  MPP_RET MVar1;
  
  if (ctx == (MppDecVprocCtx)0x0) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL input\n","dec_vproc_start");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)vproc_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","in\n","dec_vproc_start");
    }
    if (*(MppThread **)((long)ctx + 0x18) == (MppThread *)0x0) {
      _mpp_log_l(2,"mpp_dec_vproc","failed to start dec vproc thread\n",(char *)0x0);
    }
    else {
      MppThread::start(*(MppThread **)((long)ctx + 0x18));
    }
    MVar1 = MPP_OK;
    if (((byte)vproc_debug & 1) != 0) {
      MVar1 = MPP_OK;
      _mpp_log_l(4,"mpp_dec_vproc","out\n","dec_vproc_start");
    }
  }
  return MVar1;
}

Assistant:

MPP_RET dec_vproc_start(MppDecVprocCtx ctx)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }
    vproc_dbg_func("in\n");

    MppDecVprocCtxImpl *p = (MppDecVprocCtxImpl *)ctx;

    if (p->thd)
        p->thd->start();
    else
        mpp_err("failed to start dec vproc thread\n");

    vproc_dbg_func("out\n");
    return MPP_OK;
}